

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O2

CURLcode Curl_client_write(Curl_easy *data,int type,char *ptr,size_t len)

{
  curl_off_t *pcVar1;
  undefined1 *puVar2;
  connectdata *pcVar3;
  void *pvVar4;
  byte bVar5;
  uchar type_00;
  CURLcode CVar6;
  short *psVar7;
  size_t sVar8;
  curl_write_callback p_Var9;
  size_t sVar10;
  short *psVar11;
  size_t sVar12;
  char *pcVar13;
  curl_write_callback local_58;
  
  if (((((type & 1U) != 0) && ((data->conn->handler->protocol & 0xc) != 0)) &&
      ((data->conn->proto).ftpc.transfertype == 'A')) && (len != 0 && ptr != (char *)0x0)) {
    bVar5 = (data->state).field_0x51a;
    if ((bVar5 & 1) != 0) {
      if (*ptr == '\n') {
        len = len - 1;
        memmove(ptr,ptr + 1,len);
        pcVar1 = &(data->state).crlf_conversions;
        *pcVar1 = *pcVar1 + 1;
        bVar5 = (data->state).field_0x51a;
      }
      (data->state).field_0x51a = bVar5 & 0xfe;
    }
    psVar7 = (short *)memchr(ptr,0xd,len);
    if (psVar7 != (short *)0x0) {
      psVar11 = psVar7;
      for (; psVar7 < ptr + (len - 1); psVar7 = (short *)((long)psVar7 + 1)) {
        if (*psVar7 == 0xa0d) {
          pcVar13 = (char *)((long)psVar7 + 1);
          psVar7 = (short *)((long)psVar7 + 1);
          *(char *)psVar11 = *pcVar13;
          pcVar1 = &(data->state).crlf_conversions;
          *pcVar1 = *pcVar1 + 1;
        }
        else if ((char)*psVar7 == '\r') {
          *(char *)psVar11 = '\n';
        }
        else {
          *(char *)psVar11 = (char)*psVar7;
        }
        psVar11 = (short *)((long)psVar11 + 1);
      }
      if (psVar7 < ptr + len) {
        if ((char)*psVar7 == '\r') {
          *(char *)psVar11 = '\n';
          puVar2 = &(data->state).field_0x51a;
          *puVar2 = *puVar2 | 1;
        }
        else {
          *(char *)psVar11 = (char)*psVar7;
        }
        psVar11 = (short *)((long)psVar11 + 1);
      }
      if (psVar11 < ptr + len) {
        *(char *)psVar11 = '\0';
      }
      len = (long)psVar11 - (long)ptr;
    }
  }
  if (len == 0) {
    return CURLE_OK;
  }
  sVar12 = len;
  pcVar13 = ptr;
  if (((data->req).keepon & 0x10) != 0) goto LAB_00499745;
  if ((type & 1U) == 0) {
    p_Var9 = (curl_write_callback)0x0;
  }
  else {
    p_Var9 = (data->set).fwrite_func;
  }
  if ((type & 2U) == 0) {
LAB_0049976b:
    local_58 = (curl_write_callback)0x0;
  }
  else {
    local_58 = (data->set).fwrite_header;
    if (local_58 == (curl_write_callback)0x0) {
      if ((data->set).writeheader == (void *)0x0) goto LAB_0049976b;
      local_58 = (data->set).fwrite_func;
    }
  }
  pcVar3 = data->conn;
  pvVar4 = (data->set).out;
  for (; sVar12 != 0; sVar12 = sVar12 - sVar10) {
    sVar10 = 0x4000;
    if (sVar12 < 0x4000) {
      sVar10 = sVar12;
    }
    if (p_Var9 != (curl_write_callback)0x0) {
      Curl_set_in_callback(data,true);
      sVar8 = (*p_Var9)(pcVar13,1,sVar10,pvVar4);
      Curl_set_in_callback(data,false);
      if (sVar8 == 0x10000001) {
        if ((pcVar3->handler->flags & 0x10) == 0) goto LAB_00499745;
        pcVar13 = "Write callback asked for PAUSE when not supported";
        goto LAB_00499920;
      }
      if (sVar8 != sVar10) {
        pcVar13 = "Failure writing output to destination";
        goto LAB_00499920;
      }
    }
    pcVar13 = pcVar13 + sVar10;
  }
  if (((type & 6U) == 2) && ((pcVar3->handler->protocol & 3) != 0)) {
    type_00 = '\x04';
    if (((type & 8U) == 0) && (type_00 = '\b', (type & 0x10U) == 0)) {
      type_00 = '\x02' - ((type & 0x20U) == 0);
    }
    CVar6 = Curl_headers_push(data,ptr,type_00);
    if (CVar6 != CURLE_OK) {
      return CVar6;
    }
  }
  if (local_58 == (curl_write_callback)0x0) {
    return CURLE_OK;
  }
  Curl_set_in_callback(data,true);
  sVar12 = (*local_58)(ptr,1,len,(data->set).writeheader);
  Curl_set_in_callback(data,false);
  if (sVar12 != 0x10000001) {
    if (sVar12 == len) {
      return CURLE_OK;
    }
    pcVar13 = "Failed writing header";
LAB_00499920:
    Curl_failf(data,pcVar13);
    return CURLE_WRITE_ERROR;
  }
  type = type & 0x3cU | 2;
  sVar12 = len;
  pcVar13 = ptr;
LAB_00499745:
  CVar6 = pausewrite(data,type,pcVar13,sVar12);
  return CVar6;
}

Assistant:

CURLcode Curl_client_write(struct Curl_easy *data,
                           int type,
                           char *ptr,
                           size_t len)
{
#if !defined(CURL_DISABLE_FTP) && defined(CURL_DO_LINEEND_CONV)
  /* FTP data may need conversion. */
  if((type & CLIENTWRITE_BODY) &&
     (data->conn->handler->protocol & PROTO_FAMILY_FTP) &&
     data->conn->proto.ftpc.transfertype == 'A') {
    /* convert end-of-line markers */
    len = convert_lineends(data, ptr, len);
  }
#endif
  return chop_write(data, type, ptr, len);
}